

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void parseenum(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  char *pcVar2;
  rnnenum **pprVar3;
  rnnvalue *prVar4;
  xmlChar *pxVar5;
  rnnvalue *val;
  xmlNode *chain;
  rnnenum *cur;
  _xmlNode *p_Stack_50;
  int i;
  char *variantsstr;
  char *varsetstr;
  char *prefixstr;
  int bare;
  int isinline;
  char *name;
  xmlAttr *attr;
  xmlNode *node_local;
  char *file_local;
  rnndb *db_local;
  
  name = (char *)node->properties;
  _bare = (char *)0x0;
  prefixstr._4_4_ = 0;
  prefixstr._0_4_ = 0;
  varsetstr = (char *)0x0;
  variantsstr = (char *)0x0;
  p_Stack_50 = (_xmlNode *)0x0;
  for (; name != (char *)0x0; name = *(char **)(name + 0x30)) {
    iVar1 = strcmp(*(char **)(name + 0x10),"name");
    if (iVar1 == 0) {
      _bare = getattrib(db,file,(uint)node->line,(xmlAttr *)name);
    }
    else {
      iVar1 = strcmp(*(char **)(name + 0x10),"bare");
      if (iVar1 == 0) {
        prefixstr._0_4_ = getboolattrib(db,file,(uint)node->line,(xmlAttr *)name);
      }
      else {
        iVar1 = strcmp(*(char **)(name + 0x10),"inline");
        if (iVar1 == 0) {
          prefixstr._4_4_ = getboolattrib(db,file,(uint)node->line,(xmlAttr *)name);
        }
        else {
          iVar1 = strcmp(*(char **)(name + 0x10),"prefix");
          if (iVar1 == 0) {
            pcVar2 = getattrib(db,file,(uint)node->line,(xmlAttr *)name);
            varsetstr = strdup(pcVar2);
          }
          else {
            iVar1 = strcmp(*(char **)(name + 0x10),"varset");
            if (iVar1 == 0) {
              pcVar2 = getattrib(db,file,(uint)node->line,(xmlAttr *)name);
              variantsstr = strdup(pcVar2);
            }
            else {
              iVar1 = strcmp(*(char **)(name + 0x10),"variants");
              if (iVar1 == 0) {
                pcVar2 = getattrib(db,file,(uint)node->line,(xmlAttr *)name);
                p_Stack_50 = (_xmlNode *)strdup(pcVar2);
              }
              else {
                fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for enum\n",file,(ulong)node->line,
                        *(undefined8 *)(name + 0x10));
                db->estatus = 1;
              }
            }
          }
        }
      }
    }
  }
  if (_bare == (char *)0x0) {
    fprintf(_stderr,"%s:%d: nameless enum\n",file,(ulong)node->line);
    db->estatus = 1;
  }
  else {
    chain = (xmlNode *)0x0;
    for (cur._4_4_ = 0; cur._4_4_ < db->enumsnum; cur._4_4_ = cur._4_4_ + 1) {
      iVar1 = strcmp(db->enums[cur._4_4_]->name,_bare);
      if (iVar1 == 0) {
        chain = (xmlNode *)db->enums[cur._4_4_];
        break;
      }
    }
    if (chain == (xmlNode *)0x0) {
      chain = (xmlNode *)calloc(0x78,1);
      pcVar2 = strdup(_bare);
      chain->_private = pcVar2;
      *(int *)&chain->field_0xc = prefixstr._4_4_;
      chain->type = (xmlElementType)prefixstr;
      ((rnnvarinfo *)&chain->name)->prefixstr = varsetstr;
      chain->children = (_xmlNode *)variantsstr;
      chain->last = p_Stack_50;
      *(char **)&chain->line = file;
      if (db->enumsmax <= db->enumsnum) {
        if (db->enumsmax == 0) {
          db->enumsmax = 0x10;
        }
        else {
          db->enumsmax = db->enumsmax << 1;
        }
        pprVar3 = (rnnenum **)realloc(db->enums,(long)db->enumsmax << 3);
        db->enums = pprVar3;
      }
      iVar1 = db->enumsnum;
      db->enumsnum = iVar1 + 1;
      db->enums[iVar1] = (rnnenum *)chain;
    }
    else {
      iVar1 = strdiff((char *)chain->name,varsetstr);
      if ((((iVar1 != 0) || (iVar1 = strdiff((char *)chain->children,variantsstr), iVar1 != 0)) ||
          (iVar1 = strdiff((char *)chain->last,(char *)p_Stack_50), iVar1 != 0)) ||
         ((*(int *)&chain->field_0xc != prefixstr._4_4_ ||
          (chain->type != (xmlElementType)prefixstr)))) {
        fprintf(_stderr,"%s:%d: merge fail for enum %s\n",file,(ulong)node->line,node->name);
        db->estatus = 1;
      }
      free(varsetstr);
      free(variantsstr);
      free(p_Stack_50);
    }
    for (val = (rnnvalue *)node->children; val != (rnnvalue *)0x0;
        val = *(rnnvalue **)&(val->varinfo).dead) {
      if (val->valvalid == 1) {
        iVar1 = strcmp((char *)val->value,"value");
        if (iVar1 == 0) {
          prVar4 = parsevalue(db,file,(xmlNode *)val);
          if (prVar4 != (rnnvalue *)0x0) {
            if (*(int *)((long)&chain->properties + 4) <= *(int *)&chain->properties) {
              if (*(int *)((long)&chain->properties + 4) == 0) {
                *(undefined4 *)((long)&chain->properties + 4) = 0x10;
              }
              else {
                *(int *)((long)&chain->properties + 4) = *(int *)((long)&chain->properties + 4) << 1
                ;
              }
              pxVar5 = (xmlChar *)
                       realloc(chain->content,(long)*(int *)((long)&chain->properties + 4) << 3);
              chain->content = pxVar5;
            }
            iVar1 = *(int *)&chain->properties;
            *(int *)&chain->properties = iVar1 + 1;
            *(rnnvalue **)(chain->content + (long)iVar1 * 8) = prVar4;
          }
        }
        else {
          iVar1 = trytop(db,file,(xmlNode *)val);
          if ((iVar1 == 0) && (iVar1 = trydoc(db,file,(xmlNode *)val), iVar1 == 0)) {
            fprintf(_stderr,"%s:%d: wrong tag in enum: <%s>\n",file,(ulong)(ushort)val[1].valvalid,
                    val->value);
            db->estatus = 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void parseenum(struct rnndb *db, char *file, xmlNode *node) {
	xmlAttr *attr = node->properties;
	char *name = 0;
	int isinline = 0;
	int bare = 0;
	char *prefixstr = 0;
	char *varsetstr = 0;
	char *variantsstr = 0;
	int i;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			name = getattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "bare")) {
			bare = getboolattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "inline")) {
			isinline = getboolattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "prefix")) {
			prefixstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "varset")) {
			varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for enum\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	if (!name) {
		fprintf (stderr, "%s:%d: nameless enum\n", file, node->line);
		db->estatus = 1;
		return;
	}
	struct rnnenum *cur = 0;
	for (i = 0; i < db->enumsnum; i++)
		if (!strcmp(db->enums[i]->name, name)) {
			cur = db->enums[i];
			break;
		}
	if (cur) {
		if (strdiff(cur->varinfo.prefixstr, prefixstr) ||
				strdiff(cur->varinfo.varsetstr, varsetstr) ||
				strdiff(cur->varinfo.variantsstr, variantsstr) ||
				cur->isinline != isinline || cur->bare != bare) {
			fprintf (stderr, "%s:%d: merge fail for enum %s\n", file, node->line, node->name);
			db->estatus = 1;
		}
		free(prefixstr);
		free(varsetstr);
		free(variantsstr);
	} else {
		cur = calloc(sizeof *cur, 1);
		cur->name = strdup(name);
		cur->isinline = isinline;
		cur->bare = bare;
		cur->varinfo.prefixstr = prefixstr;
		cur->varinfo.varsetstr = varsetstr;
		cur->varinfo.variantsstr = variantsstr;
		cur->file = file;
		ADDARRAY(db->enums, cur);
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!strcmp(chain->name, "value")) {
			struct rnnvalue *val = parsevalue(db, file, chain);
			if (val)
				ADDARRAY(cur->vals, val);
		} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in enum: <%s>\n", file, chain->line, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
}